

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O1

void __thiscall embree::SubdivMesh::setVertexAttributeCount(SubdivMesh *this,uint N)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  RawBufferView *pRVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  RawBufferView *pRVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong __new_size;
  ulong __n;
  
  __new_size = (ulong)N;
  uVar14 = (this->vertexAttribs).size_alloced;
  __n = uVar14;
  if ((uVar14 < __new_size) && (__n = __new_size, uVar14 != 0)) {
    while (__n = uVar14, __n < __new_size) {
      uVar14 = __n * 2 + (ulong)(__n * 2 == 0);
    }
  }
  if (__new_size < (this->vertexAttribs).size_active) {
    if (__new_size < (this->vertexAttribs).size_active) {
      lVar13 = __new_size * 0x38 + 0x30;
      uVar14 = __new_size;
      do {
        plVar3 = *(long **)((long)&((this->vertexAttribs).items)->ptr_ofs + lVar13);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x18))();
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x38;
      } while (uVar14 < (this->vertexAttribs).size_active);
    }
    (this->vertexAttribs).size_active = __new_size;
  }
  if ((this->vertexAttribs).size_alloced == __n) {
    uVar14 = (this->vertexAttribs).size_active;
    lVar13 = __new_size - uVar14;
    if (uVar14 <= __new_size && lVar13 != 0) {
      lVar11 = uVar14 * 0x38 + 0x30;
      do {
        pRVar4 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pRVar4 + lVar11 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pRVar4 + lVar11 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pRVar4 + lVar11 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pRVar4 + lVar11 + -8) = 1;
        *(undefined4 *)((long)pRVar4 + lVar11 + -4) = 0;
        *(undefined8 *)((long)&pRVar4->ptr_ofs + lVar11) = 0;
        lVar11 = lVar11 + 0x38;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    (this->vertexAttribs).size_active = __new_size;
  }
  else {
    pRVar4 = (this->vertexAttribs).items;
    pRVar10 = __gnu_cxx::new_allocator<embree::RawBufferView>::allocate
                        ((new_allocator<embree::RawBufferView> *)&this->vertexAttribs,__n,
                         (void *)0x0);
    (this->vertexAttribs).items = pRVar10;
    uVar14 = (this->vertexAttribs).size_active;
    if (uVar14 != 0) {
      lVar13 = 0x30;
      uVar12 = 0;
      do {
        pRVar10 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pRVar4 + lVar13 + -0x30);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)pRVar4 + lVar13 + -0x20);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)pRVar4 + lVar13 + -0x10);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)pRVar10 + lVar13 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)pRVar10 + lVar13 + -0x20);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        puVar1 = (undefined8 *)((long)pRVar10 + lVar13 + -0x30);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        *(undefined8 *)((long)&pRVar10->ptr_ofs + lVar13) =
             *(undefined8 *)((long)&pRVar4->ptr_ofs + lVar13);
        *(undefined8 *)((long)&pRVar4->ptr_ofs + lVar13) = 0;
        uVar12 = uVar12 + 1;
        uVar14 = (this->vertexAttribs).size_active;
        lVar13 = lVar13 + 0x38;
      } while (uVar12 < uVar14);
    }
    lVar13 = __new_size - uVar14;
    if (uVar14 <= __new_size && lVar13 != 0) {
      lVar11 = uVar14 * 0x38 + 0x30;
      do {
        pRVar10 = (this->vertexAttribs).items;
        puVar1 = (undefined8 *)((long)pRVar10 + lVar11 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pRVar10 + lVar11 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pRVar10 + lVar11 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pRVar10 + lVar11 + -8) = 1;
        *(undefined4 *)((long)pRVar10 + lVar11 + -4) = 0;
        *(undefined8 *)((long)&pRVar10->ptr_ofs + lVar11) = 0;
        lVar11 = lVar11 + 0x38;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    operator_delete(pRVar4);
    (this->vertexAttribs).size_active = __new_size;
    (this->vertexAttribs).size_alloced = __n;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_attrib_buffer_tags,__new_size);
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void SubdivMesh::setVertexAttributeCount (unsigned int N)
  {
    vertexAttribs.resize(N);
    vertex_attrib_buffer_tags.resize(N);
    Geometry::update();
  }